

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  bool bVar1;
  Limit limit;
  int iVar2;
  int value;
  uint32 length;
  uint32 temp;
  uint32 local_3c;
  uint32 local_38;
  uint32 local_34;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_38);
  if (bVar1) {
    limit = io::CodedInputStream::PushLimit(input,local_38);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_34);
      if (!bVar1) goto LAB_0018ccc4;
      local_3c = local_34;
      bVar1 = (*is_valid)(local_34);
      if (bVar1) {
        RepeatedField<int>::Add(values,(int *)&local_3c);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar1 = true;
  }
  else {
LAB_0018ccc4:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}